

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateParsingCode
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *pcVar1;
  
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    pcVar1 = "java.lang.String s = input.readStringRequireUtf8();\n";
  }
  else {
    pcVar1 = "com.google.protobuf.ByteString bs = input.readBytes();\n";
    if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa2) != '\0') {
      pcVar1 = "java.lang.String s = input.readStringRequireUtf8();\n";
    }
  }
  variables = &this->variables_;
  io::Printer::Print(printer,variables,pcVar1);
  io::Printer::Print(printer,variables,
                     "if (!$get_mutable_bit_parser$) {\n  $name$_ = new com.google.protobuf.LazyStringArrayList();\n  $set_mutable_bit_parser$;\n}\n"
                    );
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    pcVar1 = "$name$_.add(s);\n";
  }
  else {
    pcVar1 = "$name$_.add(bs);\n";
    if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa2) != '\0') {
      pcVar1 = "$name$_.add(s);\n";
    }
  }
  io::Printer::Print(printer,variables,pcVar1);
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
    "java.lang.String s = input.readStringRequireUtf8();\n");
  } else {
    printer->Print(variables_,
    "com.google.protobuf.ByteString bs = input.readBytes();\n");
  }
  printer->Print(variables_,
    "if (!$get_mutable_bit_parser$) {\n"
    "  $name$_ = new com.google.protobuf.LazyStringArrayList();\n"
    "  $set_mutable_bit_parser$;\n"
    "}\n");
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "$name$_.add(s);\n");
  } else {
    printer->Print(variables_,
      "$name$_.add(bs);\n");
  }
}